

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O3

void __thiscall xe::TcpIpLink::TcpIpLink(TcpIpLink *this)

{
  Socket *this_00;
  TcpIpLinkState *this_01;
  deTimer *pdVar1;
  Error *this_02;
  
  CommLink::CommLink(&this->super_CommLink);
  (this->super_CommLink)._vptr_CommLink = (_func_int **)&PTR__TcpIpLink_0014f810;
  this_00 = &this->m_socket;
  de::Socket::Socket(this_00);
  this_01 = &this->m_state;
  TcpIpLinkState::TcpIpLinkState(this_01,COMMLINKSTATE_ERROR,"Not connected");
  TcpIpSendThread::TcpIpSendThread(&this->m_sendThread,this_00,this_01);
  de::Thread::Thread(&(this->m_recvThread).super_Thread);
  (this->m_recvThread).super_Thread._vptr_Thread = (_func_int **)&PTR__TcpIpRecvThread_0014f7e8;
  (this->m_recvThread).m_socket = this_00;
  (this->m_recvThread).m_state = this_01;
  (this->m_recvThread).m_curMsgBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recvThread).m_curMsgBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_recvThread).m_curMsgBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recvThread).m_curMsgPos = 0;
  (this->m_recvThread).m_isRunning = false;
  this->m_keepaliveTimer = (deTimer *)0x0;
  pdVar1 = deTimer_create(keepaliveTimerCallback,this);
  this->m_keepaliveTimer = pdVar1;
  if (pdVar1 != (deTimer *)0x0) {
    return;
  }
  this_02 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(this_02,(char *)0x0,"m_keepaliveTimer",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
               ,0x1a5);
  __cxa_throw(this_02,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TcpIpLink::TcpIpLink (void)
	: m_state			(COMMLINKSTATE_ERROR, "Not connected")
	, m_sendThread		(m_socket, m_state)
	, m_recvThread		(m_socket, m_state)
	, m_keepaliveTimer	(DE_NULL)
{
	m_keepaliveTimer = deTimer_create(keepaliveTimerCallback, this);
	XE_CHECK(m_keepaliveTimer);
}